

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

void __thiscall
icu_63::DateTimePatternGenerator::~DateTimePatternGenerator(DateTimePatternGenerator *this)

{
  Hashtable *this_00;
  void *in_RSI;
  long lVar1;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DateTimePatternGenerator_00479730;
  this_00 = this->fAvailableFormatKeyHash;
  if (this_00 != (Hashtable *)0x0) {
    if (this_00->hash != (UHashtable *)0x0) {
      uhash_close_63(this_00->hash);
    }
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
  }
  if (this->fp != (FormatParser *)0x0) {
    (*this->fp->_vptr_FormatParser[1])();
  }
  if (this->dtMatcher != (DateTimeMatcher *)0x0) {
    (*this->dtMatcher->_vptr_DateTimeMatcher[1])();
  }
  if (this->distanceInfo != (DistanceInfo *)0x0) {
    (*this->distanceInfo->_vptr_DistanceInfo[1])();
  }
  if (this->patternMap != (PatternMap *)0x0) {
    (*this->patternMap->_vptr_PatternMap[1])();
  }
  if (this->skipMatcher != (DateTimeMatcher *)0x0) {
    (*this->skipMatcher->_vptr_DateTimeMatcher[1])();
  }
  icu_63::UnicodeString::~UnicodeString(&this->emptyString);
  icu_63::UnicodeString::~UnicodeString(&this->decimal);
  icu_63::UnicodeString::~UnicodeString(&this->dateTimeFormat);
  lVar1 = 0x10c8;
  do {
    icu_63::UnicodeString::~UnicodeString
              ((UnicodeString *)((this->pLocale).language + lVar1 + -0x10));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != 0x4c8);
  lVar1 = 0x4c8;
  do {
    icu_63::UnicodeString::~UnicodeString
              ((UnicodeString *)((this->pLocale).language + lVar1 + -0x10));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != 200);
  Locale::~Locale(&this->pLocale);
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

DateTimePatternGenerator::~DateTimePatternGenerator() {
    if (fAvailableFormatKeyHash!=nullptr) {
        delete fAvailableFormatKeyHash;
    }

    if (fp != nullptr) delete fp;
    if (dtMatcher != nullptr) delete dtMatcher;
    if (distanceInfo != nullptr) delete distanceInfo;
    if (patternMap != nullptr) delete patternMap;
    if (skipMatcher != nullptr) delete skipMatcher;
}